

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_16ac71::DirectoryTreeSignatureTask::provideValue
          (DirectoryTreeSignatureTask *this,TaskInterface ti,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  pointer *ppSVar1;
  pointer pSVar2;
  char *pcVar3;
  SubpathInfo *__last;
  SubpathInfo *__first;
  bool bVar4;
  ulong uVar5;
  FileInfo *this_00;
  ulong uVar6;
  SubpathInfo *__result;
  SubpathInfo *pSVar7;
  long lVar8;
  Twine *pTVar9;
  allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo> *__alloc;
  SubpathInfo *__args;
  allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo> *paVar10;
  SubpathInfo *extraout_RDX;
  allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo> *extraout_RDX_00;
  long lVar11;
  uintptr_t inputID_00;
  StringRef path;
  StringRef path_00;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> filenames;
  TaskInterface ti_local;
  Twine local_258;
  Twine local_238;
  SubpathInfo local_220;
  BuildValue value;
  Twine local_158;
  SmallString<256U> childPath;
  
  ti_local.ctx = ti.ctx;
  ti_local.impl = ti.impl;
  if (inputID == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&this->directoryValue,valueData);
    llbuild::buildsystem::BuildValue::fromData(&value,valueData);
    if ((this->filters).size == 0) {
      if (value.kind != DirectoryContents) goto LAB_0013ff5c;
    }
    else if (value.kind != FilteredDirectoryContents) goto LAB_0013ff5c;
    llbuild::buildsystem::BuildValue::getDirectoryContents(&filenames,&value);
    inputID_00 = 1;
    lVar11 = 0;
    while( true ) {
      if (inputID_00 - 1 ==
          (long)filenames.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)filenames.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4) break;
      pcVar3 = (this->path)._M_dataplus._M_p;
      llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
                (&childPath.super_SmallVector<char,_256U>,pcVar3,
                 pcVar3 + (this->path)._M_string_length);
      llvm::Twine::Twine((Twine *)&local_220,
                         (StringRef *)
                         ((long)&(filenames.
                                  super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->Data + lVar11));
      llvm::Twine::Twine(&local_258,"");
      pTVar9 = &local_238;
      llvm::Twine::Twine(pTVar9,"");
      llvm::Twine::Twine(&local_158,"");
      llvm::sys::path::append
                (&childPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,
                 (Twine *)&local_220,&local_258,pTVar9,&local_158);
      llvm::StringRef::str_abi_cxx11_
                (&local_220.filename,
                 (StringRef *)
                 ((long)&(filenames.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start)->Data + lVar11));
      local_220.directorySignatureValue.Storage.hasVal = false;
      local_220.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_220.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_220.value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __last = (this->childResults).
               super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__last == (this->childResults).
                    super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __first = (this->childResults).
                  super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)__last - (long)__first == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar6 = ((long)__last - (long)__first) / 0x58;
        uVar5 = uVar6;
        if (__last == __first) {
          uVar5 = 1;
        }
        __alloc = (allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo> *)
                  (uVar5 + uVar6);
        if ((allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo> *)
            0x1745d1745d1745c < __alloc) {
          __alloc = (allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo> *)
                    0x1745d1745d1745d;
        }
        paVar10 = (allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo> *)
                  0x1745d1745d1745d;
        if (!CARRY8(uVar5,uVar6)) {
          paVar10 = __alloc;
        }
        if (paVar10 ==
            (allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo> *)0x0) {
          __result = (SubpathInfo *)0x0;
          pSVar7 = (SubpathInfo *)0x0;
        }
        else {
          __result = (SubpathInfo *)operator_new((long)paVar10 * 0x58);
          pSVar7 = extraout_RDX;
        }
        std::
        allocator_traits<std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>>
        ::
        construct<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>
                  ((allocator_type *)(__result + uVar6),&local_220,pSVar7);
        pSVar7 = std::
                 __uninitialized_move_if_noexcept_a<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo*,(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo*,std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>>
                           (__first,__last,__result,__alloc);
        pSVar7 = std::
                 __uninitialized_move_if_noexcept_a<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo*,(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo*,std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>>
                           (__last,__last,pSVar7 + 1,__alloc);
        std::
        _Destroy<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo*,(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>
                  (__first,__last,extraout_RDX_00);
        lVar8 = (long)(this->childResults).
                      super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
        pTVar9 = (Twine *)0x58;
        std::
        _Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
        ::_M_deallocate((_Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                         *)__first,(pointer)(lVar8 / 0x58),lVar8 % 0x58);
        (this->childResults).
        super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = __result;
        (this->childResults).
        super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar7;
        (this->childResults).
        super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)paVar10;
      }
      else {
        std::
        allocator_traits<std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>>
        ::
        construct<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>
                  ((allocator_type *)__last,&local_220,__args);
        ppSVar1 = &(this->childResults).
                   super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      SubpathInfo::~SubpathInfo(&local_220);
      path_00.Data = (char *)(ulong)childPath.super_SmallVector<char,_256U>.
                                    super_SmallVectorImpl<char>.
                                    super_SmallVectorTemplateBase<char,_true>.
                                    super_SmallVectorTemplateCommon<char,_void>.
                                    super_SmallVectorBase.Size;
      path_00.Length = (size_t)pTVar9;
      llbuild::buildsystem::BuildKey::makeNode
                ((BuildKey *)&local_258,
                 (BuildKey *)
                 childPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                 super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,path_00);
      std::__cxx11::string::string((string *)&local_220,(string *)&local_258);
      llbuild::core::TaskInterface::request(&ti_local,(KeyType *)&local_220,inputID_00);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      llvm::SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&childPath);
      lVar11 = lVar11 + 0x10;
      inputID_00 = inputID_00 + 1;
    }
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base
              (&filenames.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>);
  }
  else {
    pSVar2 = (this->childResults).
             super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(this->childResults).
                   super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x58;
    if (uVar5 + 1 <= inputID) {
      if (uVar5 <= ~uVar5 + inputID) {
        __assert_fail("index < childResults.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                      ,0x538,
                      "virtual void (anonymous namespace)::DirectoryTreeSignatureTask::provideValue(TaskInterface, uintptr_t, const KeyType &, const ValueType &)"
                     );
      }
      llvm::optional_detail::
      OptionalStorage<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_false>::operator=
                (&pSVar2[~uVar5 + inputID].directorySignatureValue.Storage,valueData);
      return;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&pSVar2[inputID - 1].value,valueData);
    llbuild::buildsystem::BuildValue::fromData(&value,valueData);
    if (value.kind == ExistingInput) {
      this_00 = llbuild::buildsystem::BuildValue::getOutputInfo(&value);
      bVar4 = llbuild::basic::FileInfo::isDirectory(this_00);
      if (bVar4) {
        pcVar3 = (this->path)._M_dataplus._M_p;
        llvm::SmallVector<char,256u>::SmallVector<char_const*,void>
                  (&childPath.super_SmallVector<char,_256U>,pcVar3,
                   pcVar3 + (this->path)._M_string_length);
        llvm::Twine::Twine((Twine *)&local_220,&pSVar2[inputID - 1].filename);
        llvm::Twine::Twine(&local_258,"");
        llvm::Twine::Twine((Twine *)&filenames,"");
        pTVar9 = &local_238;
        llvm::Twine::Twine(pTVar9,"");
        llvm::sys::path::append
                  (&childPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>,
                   (Twine *)&local_220,&local_258,(Twine *)&filenames,pTVar9);
        path.Data = (char *)(ulong)childPath.super_SmallVector<char,_256U>.
                                   super_SmallVectorImpl<char>.
                                   super_SmallVectorTemplateBase<char,_true>.
                                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase
                                   .Size;
        path.Length = (size_t)&this->filters;
        llbuild::buildsystem::BuildKey::makeDirectoryTreeSignature
                  ((BuildKey *)&local_258,
                   (BuildKey *)
                   childPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
                   super_SmallVectorTemplateBase<char,_true>.
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX,path,
                   (StringList *)pTVar9);
        std::__cxx11::string::string((string *)&local_220,(string *)&local_258);
        llbuild::core::TaskInterface::request
                  (&ti_local,(KeyType *)&local_220,
                   inputID + ((long)(this->childResults).
                                    super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->childResults).
                                   super__Vector_base<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeSignatureTask::SubpathInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x58);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        llvm::SmallVectorImpl<char>::~SmallVectorImpl
                  (&childPath.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>);
      }
    }
  }
LAB_0013ff5c:
  llbuild::buildsystem::BuildValue::~BuildValue(&value);
  return;
}

Assistant:

virtual void provideValue(TaskInterface ti, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    // The first input is the directory contents.
    if (inputID == 0) {
      // Record the value for the directory.
      directoryValue = valueData;

      // Request the inputs for each subpath.
      auto value = BuildValue::fromData(valueData);
      if ((filters.isEmpty() && !value.isDirectoryContents()) ||
          (!filters.isEmpty() && !value.isFilteredDirectoryContents())) {
        return;
      }

      assert(value.isFilteredDirectoryContents() || value.isDirectoryContents());
      auto filenames = value.getDirectoryContents();
      for (size_t i = 0; i != filenames.size(); ++i) {
        SmallString<256> childPath{ path };
        llvm::sys::path::append(childPath, filenames[i]);
        childResults.emplace_back(SubpathInfo{ filenames[i], {}, None });
        ti.request(BuildKey::makeNode(childPath).toData(), /*inputID=*/1 + i);
      }
      return;
    }

    // If the input is a child, add it to the collection and dispatch a
    // directory request if needed.
    if (inputID >= 1 && inputID < 1 + childResults.size()) {
      auto index = inputID - 1;
      auto& childResult = childResults[index];
      childResult.value = valueData;

      // If this node is a directory, request its signature recursively.
      auto value = BuildValue::fromData(valueData);
      if (value.isExistingInput()) {
        if (value.getOutputInfo().isDirectory()) {
          SmallString<256> childPath{ path };
          llvm::sys::path::append(childPath, childResult.filename);

          ti.request(BuildKey::makeDirectoryTreeSignature(childPath,
                                                          filters).toData(),
                     /*inputID=*/1 + childResults.size() + index);
        }
      }
      return;
    }

    // Otherwise, the input should be a directory signature.
    auto index = inputID - 1 - childResults.size();
    assert(index < childResults.size());
    childResults[index].directorySignatureValue = valueData;
  }